

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O2

int __thiscall ncnn::LSTM_x86::create_pipeline_int8(LSTM_x86 *this,Option *opt)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  uint _h;
  int iVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  size_t sVar14;
  size_t sVar15;
  void *pvVar16;
  void *pvVar17;
  void *pvVar18;
  void *pvVar19;
  int *piVar20;
  Allocator *pAVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  undefined1 *puVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  undefined1 *puVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  uint _c;
  undefined1 *puVar37;
  undefined1 *puVar38;
  ulong uVar39;
  long lVar40;
  undefined1 *puVar41;
  undefined1 *puVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  undefined1 *puVar46;
  long lVar47;
  undefined1 *puVar48;
  long lVar49;
  undefined1 *puVar50;
  undefined1 *puVar51;
  undefined1 *puVar52;
  undefined1 *puVar53;
  long lVar54;
  undefined4 *puVar55;
  undefined1 *puVar56;
  undefined1 *puVar57;
  undefined1 *puVar58;
  undefined1 *local_208;
  void *local_200;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  long local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  
  _c = ((this->super_LSTM).direction == 2) + 1;
  uVar33 = (long)(this->super_LSTM).weight_data_size / (long)(int)_c;
  _h = (this->super_LSTM).hidden_size;
  uVar33 = (long)((ulong)(uint)((int)uVar33 >> 0x1f) << 0x20 | uVar33 & 0xffffffff) / (long)(int)_h;
  iVar9 = (this->super_LSTM).num_output;
  lVar23 = (long)iVar9;
  iVar22 = (int)((long)((ulong)(uint)((int)uVar33 >> 0x1f) << 0x20 | uVar33 & 0xffffffff) / 4);
  Mat::create(&this->weight_data_tm,iVar9 + iVar22,_h,_c,4,4,(Allocator *)0x0);
  Mat::create(&this->weight_data_tm_int8_descales,8,_h,_c,4,(Allocator *)0x0);
  Mat::create(&this->bias_c_data_packed,_h,1,_c,0x10,4,(Allocator *)0x0);
  uVar39 = 0;
  lVar32 = (long)iVar22;
  lVar28 = (long)(int)(_h * 3);
  lVar24 = (long)(int)(_h * 2);
  lVar29 = (long)(int)_h;
  uVar33 = 0;
  if (0 < (int)_h) {
    uVar33 = (ulong)_h;
  }
  for (; uVar39 != _c; uVar39 = uVar39 + 1) {
    lVar34 = (long)(this->super_LSTM).weight_xc_data.w;
    pvVar10 = (this->super_LSTM).weight_xc_data.data;
    sVar11 = (this->super_LSTM).weight_xc_data.elemsize;
    sVar12 = (this->super_LSTM).bias_c_data.elemsize;
    lVar25 = (this->super_LSTM).bias_c_data.cstep * uVar39 * sVar12;
    pvVar13 = (this->weight_data_tm).data;
    sVar14 = (this->weight_data_tm).cstep;
    iVar9 = (this->weight_data_tm_int8_descales).w;
    sVar15 = (this->weight_data_tm_int8_descales).elemsize;
    lVar26 = (this->weight_data_tm_int8_descales).cstep * uVar39 * sVar15;
    lVar54 = (long)(this->super_LSTM).bias_c_data.w * sVar12;
    lVar44 = sVar11 * lVar34;
    lVar45 = (this->super_LSTM).weight_xc_data.cstep * uVar39;
    lVar47 = (lVar28 * lVar34 + lVar45) * sVar11;
    lVar49 = (lVar24 * lVar34 + lVar45) * sVar11;
    lVar34 = (lVar34 * lVar29 + lVar45) * sVar11;
    sVar12 = (this->weight_data_tm).elemsize;
    lVar30 = (long)(this->weight_data_tm).w * sVar12;
    puVar1 = (undefined1 *)(lVar47 + (long)pvVar10);
    local_200 = (void *)(sVar14 * sVar12 * uVar39 + (long)pvVar13);
    puVar2 = (undefined1 *)(lVar49 + (long)pvVar10);
    puVar27 = (undefined1 *)((long)pvVar10 + lVar47 + 1);
    puVar38 = (undefined1 *)((long)pvVar10 + lVar49 + 1);
    puVar7 = (undefined1 *)((long)pvVar10 + lVar34);
    puVar53 = (undefined1 *)((long)pvVar10 + lVar34 + 1);
    puVar8 = (undefined1 *)((long)pvVar10 + lVar45 * sVar11);
    puVar42 = (undefined1 *)((long)pvVar10 + lVar45 * sVar11 + 1);
    lVar34 = (long)(this->super_LSTM).weight_hc_data.w;
    sVar11 = (this->super_LSTM).weight_hc_data.elemsize;
    lVar49 = sVar11 * lVar34;
    lVar35 = (this->super_LSTM).weight_hc_data.cstep * uVar39;
    lVar40 = (lVar28 * lVar34 + lVar35) * sVar11;
    lVar43 = (lVar24 * lVar34 + lVar35) * sVar11;
    lVar34 = (lVar34 * lVar29 + lVar35) * sVar11;
    pvVar10 = (this->super_LSTM).bias_c_data.data;
    lVar45 = (long)(this->super_LSTM).weight_xc_data_int8_scales.w * uVar39 *
             (this->super_LSTM).weight_xc_data_int8_scales.elemsize;
    pvVar16 = (this->super_LSTM).weight_xc_data_int8_scales.data;
    lVar47 = (long)(this->super_LSTM).weight_hc_data_int8_scales.w * uVar39 *
             (this->super_LSTM).weight_hc_data_int8_scales.elemsize;
    pvVar17 = (this->super_LSTM).weight_hc_data_int8_scales.data;
    puVar55 = (undefined4 *)
              ((this->bias_c_data_packed).cstep * uVar39 * (this->bias_c_data_packed).elemsize +
              (long)(this->bias_c_data_packed).data);
    pvVar18 = (this->weight_data_tm_int8_descales).data;
    pvVar19 = (this->super_LSTM).weight_hc_data.data;
    puVar3 = (undefined1 *)((long)pvVar19 + lVar40);
    local_168 = (undefined1 *)((long)pvVar19 + lVar40 + 1);
    puVar4 = (undefined1 *)((long)pvVar19 + lVar43);
    puVar50 = (undefined1 *)((long)pvVar19 + lVar43 + 1);
    puVar5 = (undefined1 *)((long)pvVar19 + lVar34);
    local_170 = (undefined1 *)((long)pvVar19 + lVar34 + 1);
    puVar6 = (undefined1 *)((long)pvVar19 + lVar35 * sVar11);
    local_178 = (undefined1 *)((long)pvVar19 + lVar35 * sVar11 + 1);
    lVar34 = 3;
    local_180 = 3;
    local_208 = puVar6;
    local_1d0 = puVar1;
    local_1c8 = puVar2;
    local_1c0 = puVar7;
    local_1b8 = puVar8;
    local_1b0 = puVar3;
    local_1a8 = puVar4;
    local_1a0 = puVar5;
    for (uVar36 = 0; uVar36 != uVar33; uVar36 = uVar36 + 1) {
      *puVar55 = *(undefined4 *)((long)pvVar10 + uVar36 * 4 + lVar25);
      puVar55[1] = *(undefined4 *)((long)pvVar10 + uVar36 * 4 + lVar54 + lVar25);
      puVar55[2] = *(undefined4 *)((long)pvVar10 + uVar36 * 4 + lVar54 * 2 + lVar25);
      puVar55[3] = *(undefined4 *)((long)pvVar10 + uVar36 * 4 + lVar54 * 3 + lVar25);
      puVar51 = (undefined1 *)((long)pvVar13 + lVar30 * uVar36 + sVar14 * uVar39 * sVar12);
      puVar31 = puVar27;
      puVar37 = puVar38;
      lVar35 = lVar34;
      puVar41 = puVar42;
      puVar46 = local_1b8;
      puVar48 = local_1c8;
      puVar52 = puVar53;
      puVar56 = local_1d0;
      puVar57 = local_1c0;
      for (lVar40 = 0; lVar40 + 7 < lVar32; lVar40 = lVar40 + 8) {
        *(undefined8 *)((long)local_200 + lVar40 * 4) = *(undefined8 *)(local_1b8 + lVar40);
        *(undefined8 *)((long)local_200 + lVar40 * 4 + 8) = *(undefined8 *)(local_1c0 + lVar40);
        *(undefined8 *)((long)local_200 + lVar40 * 4 + 0x10) = *(undefined8 *)(local_1c8 + lVar40);
        *(undefined8 *)((long)local_200 + lVar40 * 4 + 0x18) = *(undefined8 *)(local_1d0 + lVar40);
        puVar51 = puVar51 + 0x20;
        lVar35 = lVar35 + 8;
        puVar31 = puVar31 + 8;
        puVar37 = puVar37 + 8;
        puVar52 = puVar52 + 8;
        puVar41 = puVar41 + 8;
        puVar56 = puVar56 + 8;
        puVar48 = puVar48 + 8;
        puVar57 = puVar57 + 8;
        puVar46 = puVar46 + 8;
      }
      lVar43 = (long)iVar9 * sVar15 * uVar36;
      for (; lVar40 + 3 < lVar32; lVar40 = lVar40 + 4) {
        *puVar51 = puVar8[lVar35 + -3];
        puVar51[1] = puVar8[lVar35 + -2];
        puVar51[2] = puVar8[lVar35 + -1];
        puVar51[3] = puVar8[lVar35];
        puVar51[4] = puVar7[lVar35 + -3];
        puVar51[5] = puVar7[lVar35 + -2];
        puVar51[6] = puVar7[lVar35 + -1];
        puVar51[7] = puVar7[lVar35];
        puVar51[8] = puVar2[lVar35 + -3];
        puVar51[9] = puVar2[lVar35 + -2];
        puVar51[10] = puVar2[lVar35 + -1];
        puVar51[0xb] = puVar2[lVar35];
        puVar51[0xc] = puVar1[lVar35 + -3];
        puVar51[0xd] = puVar1[lVar35 + -2];
        puVar51[0xe] = puVar1[lVar35 + -1];
        puVar51[0xf] = puVar1[lVar35];
        puVar51 = puVar51 + 0x10;
        lVar35 = lVar35 + 4;
        puVar31 = puVar31 + 4;
        puVar37 = puVar37 + 4;
        puVar52 = puVar52 + 4;
        puVar41 = puVar41 + 4;
        puVar56 = puVar56 + 4;
        puVar48 = puVar48 + 4;
        puVar57 = puVar57 + 4;
        puVar46 = puVar46 + 4;
      }
      for (; lVar40 + 1 < lVar32; lVar40 = lVar40 + 2) {
        *puVar51 = puVar41[-1];
        puVar51[1] = *puVar41;
        puVar51[2] = puVar52[-1];
        puVar51[3] = *puVar52;
        puVar51[4] = puVar37[-1];
        puVar51[5] = *puVar37;
        puVar51[6] = puVar31[-1];
        puVar51[7] = *puVar31;
        puVar51 = puVar51 + 8;
        puVar31 = puVar31 + 2;
        puVar37 = puVar37 + 2;
        puVar52 = puVar52 + 2;
        puVar41 = puVar41 + 2;
        puVar56 = puVar56 + 2;
        puVar48 = puVar48 + 2;
        puVar57 = puVar57 + 2;
        puVar46 = puVar46 + 2;
      }
      for (; lVar40 < lVar32; lVar40 = lVar40 + 1) {
        *puVar51 = *puVar46;
        puVar51[1] = *puVar57;
        puVar51[2] = *puVar48;
        puVar51[3] = *puVar56;
        puVar51 = puVar51 + 4;
        puVar56 = puVar56 + 1;
        puVar48 = puVar48 + 1;
        puVar57 = puVar57 + 1;
        puVar46 = puVar46 + 1;
      }
      puVar31 = puVar50;
      lVar35 = local_180;
      puVar37 = local_170;
      puVar41 = local_168;
      puVar46 = puVar51;
      puVar48 = local_208;
      puVar52 = local_1a0;
      puVar56 = local_178;
      puVar57 = local_1a8;
      puVar58 = local_1b0;
      for (lVar40 = 0; lVar40 + 7 < lVar23; lVar40 = lVar40 + 8) {
        *(undefined8 *)(puVar51 + lVar40 * 4) = *(undefined8 *)(local_208 + lVar40);
        *(undefined8 *)(puVar51 + lVar40 * 4 + 8) = *(undefined8 *)(local_1a0 + lVar40);
        *(undefined8 *)(puVar51 + lVar40 * 4 + 0x10) = *(undefined8 *)(local_1a8 + lVar40);
        *(undefined8 *)(puVar51 + lVar40 * 4 + 0x18) = *(undefined8 *)(local_1b0 + lVar40);
        puVar46 = puVar46 + 0x20;
        lVar35 = lVar35 + 8;
        puVar41 = puVar41 + 8;
        puVar31 = puVar31 + 8;
        puVar37 = puVar37 + 8;
        puVar56 = puVar56 + 8;
        puVar58 = puVar58 + 8;
        puVar57 = puVar57 + 8;
        puVar52 = puVar52 + 8;
        puVar48 = puVar48 + 8;
      }
      for (; lVar40 + 3 < lVar23; lVar40 = lVar40 + 4) {
        *puVar46 = puVar6[lVar35 + -3];
        puVar46[1] = puVar6[lVar35 + -2];
        puVar46[2] = puVar6[lVar35 + -1];
        puVar46[3] = puVar6[lVar35];
        puVar46[4] = puVar5[lVar35 + -3];
        puVar46[5] = puVar5[lVar35 + -2];
        puVar46[6] = puVar5[lVar35 + -1];
        puVar46[7] = puVar5[lVar35];
        puVar46[8] = puVar4[lVar35 + -3];
        puVar46[9] = puVar4[lVar35 + -2];
        puVar46[10] = puVar4[lVar35 + -1];
        puVar46[0xb] = puVar4[lVar35];
        puVar46[0xc] = puVar3[lVar35 + -3];
        puVar46[0xd] = puVar3[lVar35 + -2];
        puVar46[0xe] = puVar3[lVar35 + -1];
        puVar46[0xf] = puVar3[lVar35];
        puVar46 = puVar46 + 0x10;
        lVar35 = lVar35 + 4;
        puVar41 = puVar41 + 4;
        puVar31 = puVar31 + 4;
        puVar37 = puVar37 + 4;
        puVar56 = puVar56 + 4;
        puVar58 = puVar58 + 4;
        puVar57 = puVar57 + 4;
        puVar52 = puVar52 + 4;
        puVar48 = puVar48 + 4;
      }
      for (; lVar40 + 1 < lVar23; lVar40 = lVar40 + 2) {
        *puVar46 = puVar56[-1];
        puVar46[1] = *puVar56;
        puVar46[2] = puVar37[-1];
        puVar46[3] = *puVar37;
        puVar46[4] = puVar31[-1];
        puVar46[5] = *puVar31;
        puVar46[6] = puVar41[-1];
        puVar46[7] = *puVar41;
        puVar46 = puVar46 + 8;
        puVar41 = puVar41 + 2;
        puVar31 = puVar31 + 2;
        puVar37 = puVar37 + 2;
        puVar56 = puVar56 + 2;
        puVar58 = puVar58 + 2;
        puVar57 = puVar57 + 2;
        puVar52 = puVar52 + 2;
        puVar48 = puVar48 + 2;
      }
      for (lVar35 = 0; lVar40 + lVar35 < lVar23; lVar35 = lVar35 + 1) {
        puVar46[lVar35 * 4] = *puVar48;
        puVar46[lVar35 * 4 + 1] = *puVar52;
        puVar46[lVar35 * 4 + 2] = *puVar57;
        puVar46[lVar35 * 4 + 3] = *puVar58;
        puVar58 = puVar58 + 1;
        puVar57 = puVar57 + 1;
        puVar52 = puVar52 + 1;
        puVar48 = puVar48 + 1;
      }
      *(float *)((long)pvVar18 + lVar43 + lVar26) =
           1.0 / *(float *)((long)pvVar16 + uVar36 * 4 + lVar45);
      *(float *)((long)pvVar18 + lVar43 + lVar26 + 4) =
           1.0 / *(float *)((long)pvVar16 + (uVar36 + lVar29) * 4 + lVar45);
      *(float *)((long)pvVar18 + lVar43 + lVar26 + 8) =
           1.0 / *(float *)((long)pvVar16 + (lVar24 + uVar36) * 4 + lVar45);
      *(float *)((long)pvVar18 + lVar43 + lVar26 + 0xc) =
           1.0 / *(float *)((long)pvVar16 + (lVar28 + uVar36) * 4 + lVar45);
      *(float *)((long)pvVar18 + lVar43 + lVar26 + 0x10) =
           1.0 / *(float *)((long)pvVar17 + uVar36 * 4 + lVar47);
      *(float *)((long)pvVar18 + lVar43 + lVar26 + 0x14) =
           1.0 / *(float *)((long)pvVar17 + (uVar36 + lVar29) * 4 + lVar47);
      *(float *)((long)pvVar18 + lVar43 + lVar26 + 0x18) =
           1.0 / *(float *)((long)pvVar17 + (lVar24 + uVar36) * 4 + lVar47);
      *(float *)((long)pvVar18 + lVar43 + lVar26 + 0x1c) =
           1.0 / *(float *)((long)pvVar17 + (lVar28 + uVar36) * 4 + lVar47);
      puVar55 = puVar55 + 4;
      local_1d0 = local_1d0 + lVar44;
      local_1c8 = local_1c8 + lVar44;
      local_1c0 = local_1c0 + lVar44;
      local_1b8 = local_1b8 + lVar44;
      local_200 = (void *)((long)local_200 + lVar30);
      lVar34 = lVar34 + lVar44;
      puVar27 = puVar27 + lVar44;
      puVar38 = puVar38 + lVar44;
      puVar53 = puVar53 + lVar44;
      puVar42 = puVar42 + lVar44;
      local_1b0 = local_1b0 + lVar49;
      local_1a8 = local_1a8 + lVar49;
      local_1a0 = local_1a0 + lVar49;
      local_208 = local_208 + lVar49;
      local_180 = local_180 + lVar49;
      local_168 = local_168 + lVar49;
      puVar50 = puVar50 + lVar49;
      local_170 = local_170 + lVar49;
      local_178 = local_178 + lVar49;
    }
  }
  if (opt->lightmode == true) {
    piVar20 = (this->super_LSTM).weight_xc_data.refcount;
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        pAVar21 = (this->super_LSTM).weight_xc_data.allocator;
        if (pAVar21 == (Allocator *)0x0) {
          free((this->super_LSTM).weight_xc_data.data);
        }
        else {
          (*pAVar21->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_xc_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.elemsize + 4) = 0;
    (this->super_LSTM).weight_xc_data.data = (void *)0x0;
    (this->super_LSTM).weight_xc_data.refcount = (int *)0x0;
    (this->super_LSTM).weight_xc_data.c = 0;
    (this->super_LSTM).weight_xc_data.dims = 0;
    (this->super_LSTM).weight_xc_data.w = 0;
    (this->super_LSTM).weight_xc_data.h = 0;
    (this->super_LSTM).weight_xc_data.d = 0;
    piVar20 = (this->super_LSTM).bias_c_data.refcount;
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        pAVar21 = (this->super_LSTM).bias_c_data.allocator;
        if (pAVar21 == (Allocator *)0x0) {
          free((this->super_LSTM).bias_c_data.data);
        }
        else {
          (*pAVar21->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).bias_c_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.elemsize + 4) = 0;
    (this->super_LSTM).bias_c_data.data = (void *)0x0;
    (this->super_LSTM).bias_c_data.refcount = (int *)0x0;
    (this->super_LSTM).bias_c_data.c = 0;
    (this->super_LSTM).bias_c_data.dims = 0;
    (this->super_LSTM).bias_c_data.w = 0;
    (this->super_LSTM).bias_c_data.h = 0;
    (this->super_LSTM).bias_c_data.d = 0;
    piVar20 = (this->super_LSTM).weight_hc_data.refcount;
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        pAVar21 = (this->super_LSTM).weight_hc_data.allocator;
        if (pAVar21 == (Allocator *)0x0) {
          free((this->super_LSTM).weight_hc_data.data);
        }
        else {
          (*pAVar21->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_hc_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.elemsize + 4) = 0;
    (this->super_LSTM).weight_hc_data.data = (void *)0x0;
    (this->super_LSTM).weight_hc_data.refcount = (int *)0x0;
    (this->super_LSTM).weight_hc_data.c = 0;
    (this->super_LSTM).weight_hc_data.dims = 0;
    (this->super_LSTM).weight_hc_data.w = 0;
    (this->super_LSTM).weight_hc_data.h = 0;
    (this->super_LSTM).weight_hc_data.d = 0;
    piVar20 = (this->super_LSTM).weight_xc_data_int8_scales.refcount;
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        pAVar21 = (this->super_LSTM).weight_xc_data_int8_scales.allocator;
        if (pAVar21 == (Allocator *)0x0) {
          free((this->super_LSTM).weight_xc_data_int8_scales.data);
        }
        else {
          (*pAVar21->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_xc_data_int8_scales.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data_int8_scales.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data_int8_scales.elemsize + 4) = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.data = (void *)0x0;
    (this->super_LSTM).weight_xc_data_int8_scales.refcount = (int *)0x0;
    (this->super_LSTM).weight_xc_data_int8_scales.c = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.dims = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.w = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.h = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.d = 0;
    piVar20 = (this->super_LSTM).weight_hc_data_int8_scales.refcount;
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        pAVar21 = (this->super_LSTM).weight_hc_data_int8_scales.allocator;
        if (pAVar21 == (Allocator *)0x0) {
          free((this->super_LSTM).weight_hc_data_int8_scales.data);
        }
        else {
          (*pAVar21->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_hc_data_int8_scales.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data_int8_scales.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data_int8_scales.elemsize + 4) = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.data = (void *)0x0;
    (this->super_LSTM).weight_hc_data_int8_scales.refcount = (int *)0x0;
    (this->super_LSTM).weight_hc_data_int8_scales.dims = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.w = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.h = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.d = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.c = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86::create_pipeline_int8(const Option& opt)
{
    // pack IFOG
    const int num_directions = direction == 2 ? 2 : 1;
    const int size = weight_data_size / num_directions / hidden_size / 4;

    lstm_transform_weight_int8(weight_xc_data, weight_xc_data_int8_scales, weight_hc_data, weight_hc_data_int8_scales, bias_c_data, weight_data_tm, weight_data_tm_int8_descales, bias_c_data_packed, size, num_output, num_directions, hidden_size, opt);

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
        weight_xc_data_int8_scales.release();
        weight_hc_data_int8_scales.release();
    }

    return 0;
}